

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::UpdateMouseInputs(void)

{
  float *pfVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  float fVar4;
  float rhs;
  ImVec2 IVar5;
  float local_64;
  float local_5c;
  float local_50;
  float local_4c;
  bool local_46;
  bool local_45;
  ImVec2 local_44;
  ImVec2 delta_from_click_pos_1;
  ImVec2 local_34;
  ImVec2 delta_from_click_pos;
  int i;
  ImGuiContext *g;
  
  pIVar2 = GImGui;
  bVar3 = IsMousePosValid(&(GImGui->IO).MousePos);
  if (bVar3) {
    IVar5 = ImFloor(&(pIVar2->IO).MousePos);
    pIVar2->LastValidMousePos = IVar5;
    (pIVar2->IO).MousePos = pIVar2->LastValidMousePos;
  }
  bVar3 = IsMousePosValid(&(pIVar2->IO).MousePos);
  if ((bVar3) && (bVar3 = IsMousePosValid(&(pIVar2->IO).MousePosPrev), bVar3)) {
    IVar5 = operator-(&(pIVar2->IO).MousePos,&(pIVar2->IO).MousePosPrev);
    (pIVar2->IO).MouseDelta = IVar5;
  }
  else {
    ImVec2::ImVec2((ImVec2 *)&delta_from_click_pos.y,0.0,0.0);
    (pIVar2->IO).MouseDelta = stack0xffffffffffffffd8;
  }
  fVar4 = (pIVar2->IO).MouseDelta.x;
  if ((((fVar4 != 0.0) || (NAN(fVar4))) || (fVar4 = (pIVar2->IO).MouseDelta.y, fVar4 != 0.0)) ||
     (NAN(fVar4))) {
    pIVar2->NavDisableMouseHover = false;
  }
  (pIVar2->IO).MousePosPrev = (pIVar2->IO).MousePos;
  for (delta_from_click_pos.x = 0.0; (int)delta_from_click_pos.x < 5;
      delta_from_click_pos.x = (float)((int)delta_from_click_pos.x + 1)) {
    local_45 = false;
    if (((pIVar2->IO).MouseDown[(int)delta_from_click_pos.x] & 1U) != 0) {
      pfVar1 = (pIVar2->IO).MouseDownDuration + (int)delta_from_click_pos.x;
      local_45 = *pfVar1 <= 0.0 && *pfVar1 != 0.0;
    }
    (pIVar2->IO).MouseClicked[(int)delta_from_click_pos.x] = local_45;
    local_46 = false;
    if (((pIVar2->IO).MouseDown[(int)delta_from_click_pos.x] & 1U) == 0) {
      local_46 = 0.0 <= (pIVar2->IO).MouseDownDuration[(int)delta_from_click_pos.x];
    }
    (pIVar2->IO).MouseReleased[(int)delta_from_click_pos.x] = local_46;
    (pIVar2->IO).MouseDownDurationPrev[(int)delta_from_click_pos.x] =
         (pIVar2->IO).MouseDownDuration[(int)delta_from_click_pos.x];
    if (((pIVar2->IO).MouseDown[(int)delta_from_click_pos.x] & 1U) == 0) {
      local_50 = -1.0;
    }
    else {
      pfVar1 = (pIVar2->IO).MouseDownDuration + (int)delta_from_click_pos.x;
      if (0.0 < *pfVar1 || *pfVar1 == 0.0) {
        local_4c = (pIVar2->IO).MouseDownDuration[(int)delta_from_click_pos.x] +
                   (pIVar2->IO).DeltaTime;
      }
      else {
        local_4c = 0.0;
      }
      local_50 = local_4c;
    }
    (pIVar2->IO).MouseDownDuration[(int)delta_from_click_pos.x] = local_50;
    (pIVar2->IO).MouseDoubleClicked[(int)delta_from_click_pos.x] = false;
    if (((pIVar2->IO).MouseClicked[(int)delta_from_click_pos.x] & 1U) == 0) {
      if (((pIVar2->IO).MouseDown[(int)delta_from_click_pos.x] & 1U) != 0) {
        bVar3 = IsMousePosValid(&(pIVar2->IO).MousePos);
        if (bVar3) {
          local_44 = operator-(&(pIVar2->IO).MousePos,
                               (pIVar2->IO).MouseClickedPos + (int)delta_from_click_pos.x);
        }
        else {
          ImVec2::ImVec2(&local_44,0.0,0.0);
        }
        fVar4 = (pIVar2->IO).MouseDragMaxDistanceSqr[(int)delta_from_click_pos.x];
        rhs = ImLengthSqr(&local_44);
        fVar4 = ImMax<float>(fVar4,rhs);
        (pIVar2->IO).MouseDragMaxDistanceSqr[(int)delta_from_click_pos.x] = fVar4;
        if (0.0 <= local_44.x) {
          local_5c = local_44.x;
        }
        else {
          local_5c = -local_44.x;
        }
        fVar4 = ImMax<float>((pIVar2->IO).MouseDragMaxDistanceAbs[(int)delta_from_click_pos.x].x,
                             local_5c);
        (pIVar2->IO).MouseDragMaxDistanceAbs[(int)delta_from_click_pos.x].x = fVar4;
        if (0.0 <= local_44.y) {
          local_64 = local_44.y;
        }
        else {
          local_64 = -local_44.y;
        }
        fVar4 = ImMax<float>((pIVar2->IO).MouseDragMaxDistanceAbs[(int)delta_from_click_pos.x].y,
                             local_64);
        (pIVar2->IO).MouseDragMaxDistanceAbs[(int)delta_from_click_pos.x].y = fVar4;
      }
    }
    else {
      if ((pIVar2->IO).MouseDoubleClickTime <=
          (float)(pIVar2->Time - (pIVar2->IO).MouseClickedTime[(int)delta_from_click_pos.x])) {
        (pIVar2->IO).MouseClickedTime[(int)delta_from_click_pos.x] = pIVar2->Time;
      }
      else {
        bVar3 = IsMousePosValid(&(pIVar2->IO).MousePos);
        if (bVar3) {
          local_34 = operator-(&(pIVar2->IO).MousePos,
                               (pIVar2->IO).MouseClickedPos + (int)delta_from_click_pos.x);
        }
        else {
          ImVec2::ImVec2(&local_34,0.0,0.0);
        }
        fVar4 = ImLengthSqr(&local_34);
        if (fVar4 < (pIVar2->IO).MouseDoubleClickMaxDist * (pIVar2->IO).MouseDoubleClickMaxDist) {
          (pIVar2->IO).MouseDoubleClicked[(int)delta_from_click_pos.x] = true;
        }
        (pIVar2->IO).MouseClickedTime[(int)delta_from_click_pos.x] =
             (double)(-(pIVar2->IO).MouseDoubleClickTime * 2.0);
      }
      (pIVar2->IO).MouseClickedPos[(int)delta_from_click_pos.x] = (pIVar2->IO).MousePos;
      (pIVar2->IO).MouseDownWasDoubleClick[(int)delta_from_click_pos.x] =
           (bool)((pIVar2->IO).MouseDoubleClicked[(int)delta_from_click_pos.x] & 1);
      ImVec2::ImVec2(&delta_from_click_pos_1,0.0,0.0);
      (pIVar2->IO).MouseDragMaxDistanceAbs[(int)delta_from_click_pos.x] = delta_from_click_pos_1;
      (pIVar2->IO).MouseDragMaxDistanceSqr[(int)delta_from_click_pos.x] = 0.0;
    }
    if ((((pIVar2->IO).MouseDown[(int)delta_from_click_pos.x] & 1U) == 0) &&
       (((pIVar2->IO).MouseReleased[(int)delta_from_click_pos.x] & 1U) == 0)) {
      (pIVar2->IO).MouseDownWasDoubleClick[(int)delta_from_click_pos.x] = false;
    }
    if (((pIVar2->IO).MouseClicked[(int)delta_from_click_pos.x] & 1U) != 0) {
      pIVar2->NavDisableMouseHover = false;
    }
  }
  return;
}

Assistant:

static void ImGui::UpdateMouseInputs()
{
    ImGuiContext& g = *GImGui;

    // Round mouse position to avoid spreading non-rounded position (e.g. UpdateManualResize doesn't support them well)
    if (IsMousePosValid(&g.IO.MousePos))
        g.IO.MousePos = g.LastValidMousePos = ImFloor(g.IO.MousePos);

    // If mouse just appeared or disappeared (usually denoted by -FLT_MAX components) we cancel out movement in MouseDelta
    if (IsMousePosValid(&g.IO.MousePos) && IsMousePosValid(&g.IO.MousePosPrev))
        g.IO.MouseDelta = g.IO.MousePos - g.IO.MousePosPrev;
    else
        g.IO.MouseDelta = ImVec2(0.0f, 0.0f);
    if (g.IO.MouseDelta.x != 0.0f || g.IO.MouseDelta.y != 0.0f)
        g.NavDisableMouseHover = false;

    g.IO.MousePosPrev = g.IO.MousePos;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        g.IO.MouseClicked[i] = g.IO.MouseDown[i] && g.IO.MouseDownDuration[i] < 0.0f;
        g.IO.MouseReleased[i] = !g.IO.MouseDown[i] && g.IO.MouseDownDuration[i] >= 0.0f;
        g.IO.MouseDownDurationPrev[i] = g.IO.MouseDownDuration[i];
        g.IO.MouseDownDuration[i] = g.IO.MouseDown[i] ? (g.IO.MouseDownDuration[i] < 0.0f ? 0.0f : g.IO.MouseDownDuration[i] + g.IO.DeltaTime) : -1.0f;
        g.IO.MouseDoubleClicked[i] = false;
        if (g.IO.MouseClicked[i])
        {
            if ((float)(g.Time - g.IO.MouseClickedTime[i]) < g.IO.MouseDoubleClickTime)
            {
                ImVec2 delta_from_click_pos = IsMousePosValid(&g.IO.MousePos) ? (g.IO.MousePos - g.IO.MouseClickedPos[i]) : ImVec2(0.0f, 0.0f);
                if (ImLengthSqr(delta_from_click_pos) < g.IO.MouseDoubleClickMaxDist * g.IO.MouseDoubleClickMaxDist)
                    g.IO.MouseDoubleClicked[i] = true;
                g.IO.MouseClickedTime[i] = -g.IO.MouseDoubleClickTime * 2.0f; // Mark as "old enough" so the third click isn't turned into a double-click
            }
            else
            {
                g.IO.MouseClickedTime[i] = g.Time;
            }
            g.IO.MouseClickedPos[i] = g.IO.MousePos;
            g.IO.MouseDownWasDoubleClick[i] = g.IO.MouseDoubleClicked[i];
            g.IO.MouseDragMaxDistanceAbs[i] = ImVec2(0.0f, 0.0f);
            g.IO.MouseDragMaxDistanceSqr[i] = 0.0f;
        }
        else if (g.IO.MouseDown[i])
        {
            // Maintain the maximum distance we reaching from the initial click position, which is used with dragging threshold
            ImVec2 delta_from_click_pos = IsMousePosValid(&g.IO.MousePos) ? (g.IO.MousePos - g.IO.MouseClickedPos[i]) : ImVec2(0.0f, 0.0f);
            g.IO.MouseDragMaxDistanceSqr[i] = ImMax(g.IO.MouseDragMaxDistanceSqr[i], ImLengthSqr(delta_from_click_pos));
            g.IO.MouseDragMaxDistanceAbs[i].x = ImMax(g.IO.MouseDragMaxDistanceAbs[i].x, delta_from_click_pos.x < 0.0f ? -delta_from_click_pos.x : delta_from_click_pos.x);
            g.IO.MouseDragMaxDistanceAbs[i].y = ImMax(g.IO.MouseDragMaxDistanceAbs[i].y, delta_from_click_pos.y < 0.0f ? -delta_from_click_pos.y : delta_from_click_pos.y);
        }
        if (!g.IO.MouseDown[i] && !g.IO.MouseReleased[i])
            g.IO.MouseDownWasDoubleClick[i] = false;
        if (g.IO.MouseClicked[i]) // Clicking any mouse button reactivate mouse hovering which may have been deactivated by gamepad/keyboard navigation
            g.NavDisableMouseHover = false;
    }
}